

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize_x86.cpp
# Opt level: O0

void ncnn::quantize(float *ptr,char *s8ptr,Mat *scale_data,int elemcount,int elempack)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  float fVar28;
  float fVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  undefined8 uVar32;
  undefined8 uVar33;
  undefined8 uVar34;
  undefined8 uVar35;
  undefined8 uVar36;
  undefined8 uVar37;
  undefined8 uVar38;
  undefined8 uVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  int in_ECX;
  long *in_RDX;
  undefined8 *in_RSI;
  float *in_RDI;
  int in_R8D;
  double dVar52;
  undefined1 auVar53 [32];
  float v_1;
  int32_t v;
  __m128 _v_1;
  __m256 _v;
  __m256 _v1;
  __m256 _v0;
  int i;
  __m256 _scale_avx;
  __m128 _scale;
  float scale;
  int size;
  int scale_data_size;
  __m128i _v8;
  __m128i _v01_s16high;
  __m128i _v01_s16low;
  __m128i _v1_i_high;
  __m128i _v1_i_low;
  __m128i _v0_i_high;
  __m128i _v0_i_low;
  __m256i _v1_i;
  __m256i _v0_i;
  __m256 _v1_adj;
  __m256 _v0_adj;
  __m256 _v1_p5;
  __m256 _v0_p5;
  __m256 _sign1;
  __m256 _sign0;
  __m256 _signmask;
  __m256 _p5;
  __m128i _v8_1;
  __m128i _v01_s16low_1;
  __m128i _v0_i_high_1;
  __m128i _v0_i_low_1;
  __m256i _v0_i_1;
  __m256 _v0_adj_1;
  __m256 _v0_p5_1;
  __m256 _sign;
  __m256 _signmask_1;
  __m256 _p5_1;
  __m128i _v8_2;
  __m128i _v0_s16;
  __m128i _v0_i_2;
  __m128 _v0_adj_2;
  __m128 _v0_p5_2;
  __m128 _sign0_1;
  __m128 _signmask_2;
  __m128 _p5_2;
  int int32;
  undefined8 local_e90;
  undefined8 uStack_e88;
  undefined8 local_e80;
  undefined8 uStack_e78;
  undefined8 uStack_e70;
  undefined8 uStack_e68;
  undefined8 local_e60;
  undefined8 uStack_e58;
  undefined8 uStack_e50;
  undefined8 uStack_e48;
  undefined8 local_e40;
  undefined8 uStack_e38;
  undefined8 uStack_e30;
  undefined8 uStack_e28;
  int local_e04;
  undefined8 local_e00;
  undefined8 uStack_df8;
  undefined8 uStack_df0;
  undefined8 uStack_de8;
  undefined8 local_dd0;
  undefined8 uStack_dc8;
  float local_dbc;
  int local_db8;
  int local_db4;
  undefined8 *local_da0;
  float *local_d98;
  undefined8 local_d80;
  float local_d70;
  float fStack_d6c;
  float fStack_d68;
  float fStack_d64;
  float local_d58;
  float local_d54;
  float *local_d50;
  float *local_d48;
  float *local_d40;
  undefined8 *local_d38;
  float *local_d30;
  undefined8 *local_d28;
  undefined8 local_d20;
  undefined8 uStack_d18;
  undefined8 local_d10;
  undefined8 uStack_d08;
  undefined8 local_d00;
  undefined8 uStack_cf8;
  undefined8 uStack_cf0;
  undefined8 uStack_ce8;
  undefined8 local_ce0;
  undefined8 uStack_cd8;
  undefined8 uStack_cd0;
  undefined8 uStack_cc8;
  undefined8 local_cc0;
  undefined8 uStack_cb8;
  undefined8 uStack_cb0;
  undefined8 uStack_ca8;
  undefined8 local_ca0;
  undefined8 uStack_c98;
  undefined8 uStack_c90;
  undefined8 uStack_c88;
  undefined8 local_c80;
  undefined8 uStack_c78;
  undefined8 uStack_c70;
  undefined8 uStack_c68;
  undefined8 local_c60;
  undefined8 uStack_c58;
  undefined8 uStack_c50;
  undefined8 uStack_c48;
  undefined8 local_c30;
  undefined8 uStack_c28;
  undefined8 *local_c18;
  undefined1 local_c10 [16];
  undefined1 local_c00 [16];
  undefined1 local_bf0 [16];
  undefined8 local_be0;
  undefined8 uStack_bd8;
  undefined8 local_bd0;
  undefined8 uStack_bc8;
  undefined8 local_bc0;
  undefined8 uStack_bb8;
  undefined8 local_bb0;
  undefined8 uStack_ba8;
  int local_ba0;
  int iStack_b9c;
  int iStack_b98;
  int iStack_b94;
  int iStack_b90;
  int iStack_b8c;
  int iStack_b88;
  int iStack_b84;
  int local_b80;
  int iStack_b7c;
  int iStack_b78;
  int iStack_b74;
  int iStack_b70;
  int iStack_b6c;
  int iStack_b68;
  int iStack_b64;
  float local_b60;
  float fStack_b5c;
  float fStack_b58;
  float fStack_b54;
  float fStack_b50;
  float fStack_b4c;
  float fStack_b48;
  float fStack_b44;
  float local_b40;
  float fStack_b3c;
  float fStack_b38;
  float fStack_b34;
  float fStack_b30;
  float fStack_b2c;
  float fStack_b28;
  float fStack_b24;
  undefined1 local_b20 [32];
  undefined1 local_b00 [32];
  undefined1 local_ae0 [32];
  undefined1 local_ac0 [32];
  undefined8 local_aa0;
  undefined8 uStack_a98;
  undefined8 uStack_a90;
  undefined8 uStack_a88;
  undefined8 local_a80;
  undefined8 uStack_a78;
  undefined8 uStack_a70;
  undefined8 uStack_a68;
  undefined8 *local_a58;
  undefined8 *local_a50;
  undefined4 local_a44;
  undefined1 local_a40 [16];
  undefined1 local_a30 [16];
  undefined8 local_a20;
  undefined8 uStack_a18;
  undefined8 local_a10;
  undefined8 uStack_a08;
  int local_a00;
  int iStack_9fc;
  int iStack_9f8;
  int iStack_9f4;
  int iStack_9f0;
  int iStack_9ec;
  int iStack_9e8;
  int iStack_9e4;
  float local_9e0;
  float fStack_9dc;
  float fStack_9d8;
  float fStack_9d4;
  float fStack_9d0;
  float fStack_9cc;
  float fStack_9c8;
  float fStack_9c4;
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [32];
  undefined8 local_980;
  undefined8 uStack_978;
  undefined8 uStack_970;
  undefined8 uStack_968;
  undefined8 local_960;
  undefined8 uStack_958;
  undefined8 uStack_950;
  undefined8 uStack_948;
  undefined8 *local_940;
  undefined4 local_934;
  undefined8 local_930;
  undefined8 uStack_928;
  undefined8 local_920;
  undefined8 uStack_918;
  undefined1 local_910 [16];
  undefined1 local_900 [16];
  int local_8f0;
  int iStack_8ec;
  int iStack_8e8;
  int iStack_8e4;
  float local_8e0;
  float fStack_8dc;
  float fStack_8d8;
  float fStack_8d4;
  undefined1 local_8d0 [16];
  undefined1 local_8c0 [16];
  undefined8 local_8b0;
  undefined8 uStack_8a8;
  undefined8 local_8a0;
  undefined8 uStack_898;
  undefined8 *local_888;
  undefined4 local_880;
  undefined4 uStack_87c;
  undefined4 uStack_878;
  undefined4 uStack_874;
  undefined4 local_870;
  int local_86c;
  float local_868;
  undefined1 local_861;
  undefined1 local_860 [16];
  undefined1 auStack_850 [16];
  undefined4 local_840;
  undefined4 local_83c;
  undefined4 local_838;
  undefined4 local_834;
  undefined4 local_830;
  undefined4 local_82c;
  undefined4 local_828;
  undefined4 local_824;
  undefined1 local_820 [16];
  undefined1 auStack_810 [16];
  undefined4 local_800;
  undefined4 local_7fc;
  undefined4 local_7f8;
  undefined4 local_7f4;
  undefined4 local_7f0;
  undefined4 local_7ec;
  undefined4 local_7e8;
  undefined4 local_7e4;
  undefined1 local_7e0 [32];
  float local_7b0;
  float local_7ac;
  float local_7a8;
  float local_7a4;
  float local_7a0;
  float local_79c;
  float local_798;
  float local_794;
  undefined8 local_790;
  undefined8 uStack_788;
  undefined8 local_780;
  undefined8 uStack_778;
  undefined8 uStack_770;
  undefined8 uStack_768;
  undefined8 local_760;
  undefined8 uStack_758;
  undefined8 uStack_750;
  undefined8 uStack_748;
  undefined4 local_728;
  undefined4 local_724;
  undefined8 local_720;
  undefined8 uStack_718;
  undefined8 uStack_710;
  undefined8 uStack_708;
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 uStack_6f0;
  undefined8 uStack_6e8;
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined8 uStack_6d0;
  undefined8 uStack_6c8;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 uStack_6b0;
  undefined8 uStack_6a8;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 uStack_690;
  undefined8 uStack_688;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 uStack_670;
  undefined8 uStack_668;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 uStack_650;
  undefined8 uStack_648;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 uStack_610;
  undefined8 uStack_608;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 uStack_5f0;
  undefined8 uStack_5e8;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 uStack_5d0;
  undefined8 uStack_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 uStack_590;
  undefined8 uStack_588;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 uStack_570;
  undefined8 uStack_568;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 uStack_550;
  undefined8 uStack_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  undefined8 local_470;
  undefined8 uStack_468;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 local_450;
  undefined8 uStack_448;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 local_430;
  undefined8 uStack_428;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 local_410;
  undefined8 uStack_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 local_3f0;
  undefined8 uStack_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 local_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 local_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 local_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined2 local_370;
  undefined2 local_36e;
  undefined2 local_36c;
  undefined2 local_36a;
  undefined2 local_368;
  undefined2 local_366;
  undefined2 local_364;
  undefined2 local_362;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 local_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 local_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 local_310;
  undefined8 uStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 local_2f0;
  undefined8 uStack_2e8;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 local_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 local_2b0;
  undefined8 uStack_2a8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 local_290;
  undefined8 uStack_288;
  undefined1 local_280 [16];
  undefined1 auStack_270 [16];
  undefined4 local_260;
  undefined4 local_25c;
  undefined4 local_258;
  undefined4 local_254;
  undefined4 local_250;
  undefined4 local_24c;
  undefined4 local_248;
  undefined4 local_244;
  undefined1 local_240 [16];
  undefined1 auStack_230 [16];
  undefined4 local_220;
  undefined4 local_21c;
  undefined4 local_218;
  undefined4 local_214;
  undefined4 local_210;
  undefined4 local_20c;
  undefined4 local_208;
  undefined4 local_204;
  undefined1 local_200 [16];
  undefined2 local_1f0;
  undefined2 local_1ee;
  undefined2 local_1ec;
  undefined2 local_1ea;
  undefined2 local_1e8;
  undefined2 local_1e6;
  undefined2 local_1e4;
  undefined2 local_1e2;
  undefined1 local_1e0 [16];
  undefined2 local_1d0;
  undefined2 local_1ce;
  undefined2 local_1cc;
  undefined2 local_1ca;
  undefined2 local_1c8;
  undefined2 local_1c6;
  undefined2 local_1c4;
  undefined2 local_1c2;
  undefined1 local_1c0 [16];
  undefined2 local_1b0;
  undefined2 local_1ae;
  undefined2 local_1ac;
  undefined2 local_1aa;
  undefined2 local_1a8;
  undefined2 local_1a6;
  undefined2 local_1a4;
  undefined2 local_1a2;
  undefined1 local_1a0 [16];
  undefined2 local_190;
  undefined2 local_18e;
  undefined2 local_18c;
  undefined2 local_18a;
  undefined2 local_188;
  undefined2 local_186;
  undefined2 local_184;
  undefined2 local_182;
  undefined1 local_180 [16];
  undefined2 local_170;
  undefined2 local_16e;
  undefined2 local_16c;
  undefined2 local_16a;
  undefined2 local_168;
  undefined2 local_166;
  undefined2 local_164;
  undefined2 local_162;
  undefined1 local_160 [16];
  undefined2 local_150;
  undefined2 local_14e;
  undefined2 local_14c;
  undefined2 local_14a;
  undefined2 local_148;
  undefined2 local_146;
  undefined2 local_144;
  undefined2 local_142;
  undefined1 local_140 [16];
  undefined2 local_130;
  undefined2 local_12e;
  undefined2 local_12c;
  undefined2 local_12a;
  undefined2 local_128;
  undefined2 local_126;
  undefined2 local_124;
  undefined2 local_122;
  undefined1 local_120 [16];
  undefined2 local_110;
  undefined2 local_10e;
  undefined2 local_10c;
  undefined2 local_10a;
  undefined2 local_108;
  undefined2 local_106;
  undefined2 local_104;
  undefined2 local_102;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 local_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined4 local_c4;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 local_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined1 local_50 [16];
  undefined4 local_40;
  undefined4 local_3c;
  undefined4 local_38;
  undefined4 local_34;
  
  local_db4 = *(int *)((long)in_RDX + 0x2c);
  local_db8 = in_ECX * in_R8D;
  local_d80 = 0;
  local_dbc = *(float *)*in_RDX;
  local_dd0 = CONCAT44(local_dbc,local_dbc);
  uStack_dc8 = CONCAT44(local_dbc,local_dbc);
  auVar1 = vinsertps_avx(ZEXT416((uint)local_dbc),ZEXT416((uint)local_dbc),0x10);
  auVar1 = vinsertps_avx(auVar1,ZEXT416((uint)local_dbc),0x20);
  auVar1 = vinsertps_avx(auVar1,ZEXT416((uint)local_dbc),0x30);
  auVar2 = vinsertps_avx(ZEXT416((uint)local_dbc),ZEXT416((uint)local_dbc),0x10);
  auVar2 = vinsertps_avx(auVar2,ZEXT416((uint)local_dbc),0x20);
  auVar2 = vinsertps_avx(auVar2,ZEXT416((uint)local_dbc),0x30);
  auVar53._16_16_ = auVar1;
  auVar53._0_16_ = auVar2;
  local_7e0._0_8_ = auVar2._0_8_;
  local_7e0._8_8_ = auVar2._8_8_;
  local_7e0._16_8_ = auVar1._0_8_;
  local_7e0._24_8_ = auVar1._8_8_;
  local_e00 = local_7e0._0_8_;
  uStack_df8 = local_7e0._8_8_;
  uStack_df0 = local_7e0._16_8_;
  uStack_de8 = local_7e0._24_8_;
  if (1 < local_db4) {
    if (in_R8D == 8) {
      local_d38 = (undefined8 *)*in_RDX;
      local_e00 = *local_d38;
      uStack_df8 = local_d38[1];
      uStack_df0 = local_d38[2];
      uStack_de8 = local_d38[3];
    }
    if (in_R8D == 4) {
      local_d28 = (undefined8 *)*in_RDX;
      local_e00 = *local_d28;
      uStack_df8 = local_d28[1];
      uStack_df0 = local_e00;
      uStack_de8 = uStack_df8;
      local_dd0 = local_e00;
      uStack_dc8 = uStack_df8;
      local_d20 = local_e00;
      uStack_d18 = uStack_df8;
      local_d10 = local_e00;
      uStack_d08 = uStack_df8;
      local_790 = local_e00;
      uStack_788 = uStack_df8;
    }
  }
  local_e04 = 0;
  uVar34 = uStack_e48;
  uVar39 = uStack_e28;
  local_da0 = in_RSI;
  local_d98 = in_RDI;
  while( true ) {
    uStack_e28 = uVar39;
    uStack_e48 = uVar34;
    uVar7 = uStack_c68;
    uVar6 = uStack_c70;
    uVar39 = uStack_c78;
    uVar34 = local_c80;
    fVar51 = uStack_e28._4_4_;
    fVar50 = uStack_e30._4_4_;
    fVar49 = uStack_e38._4_4_;
    fVar48 = local_e40._4_4_;
    fVar47 = uStack_e48._4_4_;
    fVar46 = uStack_e50._4_4_;
    fVar45 = uStack_e58._4_4_;
    fVar44 = local_e60._4_4_;
    local_c80._0_4_ = (float)local_e00;
    local_c80._4_4_ = (float)((ulong)local_e00 >> 0x20);
    uStack_c78._0_4_ = (float)uStack_df8;
    uStack_c78._4_4_ = (float)((ulong)uStack_df8 >> 0x20);
    uStack_c70._0_4_ = (float)uStack_df0;
    uStack_c70._4_4_ = (float)((ulong)uStack_df0 >> 0x20);
    uStack_c68._0_4_ = (float)uStack_de8;
    uVar4 = uStack_e68;
    if (local_db8 <= local_e04 + 0xf) break;
    local_d40 = local_d98;
    uVar6 = *(undefined8 *)local_d98;
    uVar7 = *(undefined8 *)(local_d98 + 2);
    uVar4 = *(undefined8 *)(local_d98 + 4);
    uVar5 = *(undefined8 *)(local_d98 + 6);
    local_d48 = local_d98 + 8;
    uVar8 = *(undefined8 *)local_d48;
    uVar9 = *(undefined8 *)(local_d98 + 10);
    uVar10 = *(undefined8 *)(local_d98 + 0xc);
    uVar11 = *(undefined8 *)(local_d98 + 0xe);
    local_c60._0_4_ = (float)uVar6;
    local_c60._4_4_ = (float)((ulong)uVar6 >> 0x20);
    uStack_c58._0_4_ = (float)uVar7;
    uStack_c58._4_4_ = (float)((ulong)uVar7 >> 0x20);
    uStack_c50._0_4_ = (float)uVar4;
    uStack_c50._4_4_ = (float)((ulong)uVar4 >> 0x20);
    uStack_c48._0_4_ = (float)uVar5;
    uStack_c48._4_4_ = (float)((ulong)uVar5 >> 0x20);
    local_c60._0_4_ = (float)local_c60 * (float)local_c80;
    local_e40._4_4_ = local_c60._4_4_ * local_c80._4_4_;
    uStack_c58._0_4_ = (float)uStack_c58 * (float)uStack_c78;
    uStack_e38._4_4_ = uStack_c58._4_4_ * uStack_c78._4_4_;
    uStack_c50._0_4_ = (float)uStack_c50 * (float)uStack_c70;
    uStack_e30._4_4_ = uStack_c50._4_4_ * uStack_c70._4_4_;
    uStack_c48._0_4_ = (float)uStack_c48 * (float)uStack_c68;
    local_e40 = CONCAT44(local_e40._4_4_,(float)local_c60);
    uStack_e38 = CONCAT44(uStack_e38._4_4_,(float)uStack_c58);
    uStack_e30 = CONCAT44(uStack_e30._4_4_,(float)uStack_c50);
    uStack_e28._4_4_ = uStack_c48._4_4_;
    local_cc0 = local_e00;
    uStack_cb8 = uStack_df8;
    uStack_cb0 = uStack_df0;
    uStack_ca8 = uStack_de8;
    local_ca0._0_4_ = (float)uVar8;
    local_ca0._4_4_ = (float)((ulong)uVar8 >> 0x20);
    uStack_c98._0_4_ = (float)uVar9;
    uStack_c98._4_4_ = (float)((ulong)uVar9 >> 0x20);
    uStack_c90._0_4_ = (float)uVar10;
    uStack_c90._4_4_ = (float)((ulong)uVar10 >> 0x20);
    uStack_c88._0_4_ = (float)uVar11;
    uStack_c88._4_4_ = (float)((ulong)uVar11 >> 0x20);
    local_ca0._0_4_ = (float)local_ca0 * (float)local_c80;
    local_e60._4_4_ = local_ca0._4_4_ * local_c80._4_4_;
    uStack_c98._0_4_ = (float)uStack_c98 * (float)uStack_c78;
    uStack_e58._4_4_ = uStack_c98._4_4_ * uStack_c78._4_4_;
    uStack_c90._0_4_ = (float)uStack_c90 * (float)uStack_c70;
    uStack_e50._4_4_ = uStack_c90._4_4_ * uStack_c70._4_4_;
    uStack_c88._0_4_ = (float)uStack_c88 * (float)uStack_c68;
    local_e60 = CONCAT44(local_e60._4_4_,(float)local_ca0);
    uStack_e58 = CONCAT44(uStack_e58._4_4_,(float)uStack_c98);
    uStack_e50 = CONCAT44(uStack_e50._4_4_,(float)uStack_c90);
    uStack_e48._4_4_ = uStack_c88._4_4_;
    local_c18 = local_da0;
    local_a50 = &local_e40;
    local_a58 = &local_e60;
    local_a44 = 0x3f000000;
    local_800 = 0x3f000000;
    auVar1 = vinsertps_avx(ZEXT416(0x3f000000),ZEXT416(0x3f000000),0x10);
    auVar1 = vinsertps_avx(auVar1,ZEXT416(0x3f000000),0x20);
    local_820 = vinsertps_avx(auVar1,ZEXT416(0x3f000000),0x30);
    auVar1 = vinsertps_avx(ZEXT416(0x3f000000),ZEXT416(0x3f000000),0x10);
    auVar1 = vinsertps_avx(auVar1,ZEXT416(0x3f000000),0x20);
    auStack_810 = vinsertps_avx(auVar1,ZEXT416(0x3f000000),0x30);
    local_a80 = local_820._0_8_;
    uStack_a78 = local_820._8_8_;
    uStack_a70 = auStack_810._0_8_;
    uStack_a68 = auStack_810._8_8_;
    local_724 = 0x80000000;
    local_260 = 0x80000000;
    auVar1 = vpinsrd_avx(ZEXT416(0x80000000),0x80000000,1);
    auVar1 = vpinsrd_avx(auVar1,0x80000000,2);
    local_280 = vpinsrd_avx(auVar1,0x80000000,3);
    auVar1 = vpinsrd_avx(ZEXT416(0x80000000),0x80000000,1);
    auVar1 = vpinsrd_avx(auVar1,0x80000000,2);
    auStack_270 = vpinsrd_avx(auVar1,0x80000000,3);
    local_760 = local_280._0_8_;
    uStack_758 = local_280._8_8_;
    uStack_750 = auStack_270._0_8_;
    uStack_748 = auStack_270._8_8_;
    local_aa0 = local_280._0_8_;
    uStack_a98 = local_280._8_8_;
    uStack_a90 = auStack_270._0_8_;
    uStack_a88 = auStack_270._8_8_;
    local_680 = CONCAT44(local_e40._4_4_,(float)local_c60);
    uStack_678 = CONCAT44(uStack_e38._4_4_,(float)uStack_c58);
    uStack_670 = CONCAT44(uStack_e30._4_4_,(float)uStack_c50);
    uStack_668 = CONCAT44(uStack_c48._4_4_,(float)uStack_c48);
    auVar27._4_4_ = local_e40._4_4_;
    auVar27._0_4_ = (float)local_c60;
    auVar27._8_4_ = (float)uStack_c58;
    auVar27._12_4_ = uStack_e38._4_4_;
    auVar27._16_4_ = (float)uStack_c50;
    auVar27._20_4_ = uStack_e30._4_4_;
    auVar27._24_4_ = (float)uStack_c48;
    auVar27._28_4_ = uStack_c48._4_4_;
    local_6a0 = local_280._0_8_;
    uStack_698 = local_280._8_8_;
    uStack_690 = auStack_270._0_8_;
    uStack_688 = auStack_270._8_8_;
    auVar14._16_8_ = auStack_270._0_8_;
    auVar14._0_16_ = local_280;
    auVar14._24_8_ = auStack_270._8_8_;
    local_ac0 = vandps_avx(auVar27,auVar14);
    local_6c0 = CONCAT44(local_e60._4_4_,(float)local_ca0);
    uStack_6b8 = CONCAT44(uStack_e58._4_4_,(float)uStack_c98);
    uStack_6b0 = CONCAT44(uStack_e50._4_4_,(float)uStack_c90);
    uStack_6a8 = CONCAT44(uStack_c88._4_4_,(float)uStack_c88);
    auVar26._4_4_ = local_e60._4_4_;
    auVar26._0_4_ = (float)local_ca0;
    auVar26._8_4_ = (float)uStack_c98;
    auVar26._12_4_ = uStack_e58._4_4_;
    auVar26._16_4_ = (float)uStack_c90;
    auVar26._20_4_ = uStack_e50._4_4_;
    auVar26._24_4_ = (float)uStack_c88;
    auVar26._28_4_ = uStack_c88._4_4_;
    local_6e0 = local_280._0_8_;
    uStack_6d8 = local_280._8_8_;
    uStack_6d0 = auStack_270._0_8_;
    uStack_6c8 = auStack_270._8_8_;
    auVar13._16_8_ = auStack_270._0_8_;
    auVar13._0_16_ = local_280;
    auVar13._24_8_ = auStack_270._8_8_;
    local_ae0 = vandps_avx(auVar26,auVar13);
    local_5c0 = local_820._0_8_;
    uStack_5b8 = local_820._8_8_;
    uStack_5b0 = auStack_810._0_8_;
    uStack_5a8 = auStack_810._8_8_;
    local_5e0 = local_ac0._0_8_;
    uStack_5d8 = local_ac0._8_8_;
    uStack_5d0 = local_ac0._16_8_;
    uStack_5c8 = local_ac0._24_8_;
    auVar17._16_8_ = auStack_810._0_8_;
    auVar17._0_16_ = local_820;
    auVar17._24_8_ = auStack_810._8_8_;
    local_b00 = vorps_avx(auVar17,local_ac0);
    local_600 = local_820._0_8_;
    uStack_5f8 = local_820._8_8_;
    uStack_5f0 = auStack_810._0_8_;
    uStack_5e8 = auStack_810._8_8_;
    local_620 = local_ae0._0_8_;
    uStack_618 = local_ae0._8_8_;
    uStack_610 = local_ae0._16_8_;
    uStack_608 = local_ae0._24_8_;
    auVar16._16_8_ = auStack_810._0_8_;
    auVar16._0_16_ = local_820;
    auVar16._24_8_ = auStack_810._8_8_;
    local_b20 = vorps_avx(auVar16,local_ae0);
    local_500 = CONCAT44(local_e40._4_4_,(float)local_c60);
    uStack_4f8 = CONCAT44(uStack_e38._4_4_,(float)uStack_c58);
    uStack_4f0 = CONCAT44(uStack_e30._4_4_,(float)uStack_c50);
    uStack_4e8 = CONCAT44(uStack_c48._4_4_,(float)uStack_c48);
    local_520._0_4_ = local_b00._0_4_;
    local_520._4_4_ = local_b00._4_4_;
    uStack_518._0_4_ = local_b00._8_4_;
    uStack_518._4_4_ = local_b00._12_4_;
    uStack_510._0_4_ = local_b00._16_4_;
    uStack_510._4_4_ = local_b00._20_4_;
    uStack_508._0_4_ = local_b00._24_4_;
    uStack_508._4_4_ = local_b00._28_4_;
    local_b40 = (float)local_c60 + (float)local_520;
    fStack_b3c = local_e40._4_4_ + local_520._4_4_;
    fStack_b38 = (float)uStack_c58 + (float)uStack_518;
    fStack_b34 = uStack_e38._4_4_ + uStack_518._4_4_;
    fStack_b30 = (float)uStack_c50 + (float)uStack_510;
    fStack_b2c = uStack_e30._4_4_ + uStack_510._4_4_;
    fStack_b28 = (float)uStack_c48 + (float)uStack_508;
    fStack_b24 = uStack_c48._4_4_ + uStack_508._4_4_;
    local_540 = CONCAT44(local_e60._4_4_,(float)local_ca0);
    uStack_538 = CONCAT44(uStack_e58._4_4_,(float)uStack_c98);
    uStack_530 = CONCAT44(uStack_e50._4_4_,(float)uStack_c90);
    uStack_528 = CONCAT44(uStack_c88._4_4_,(float)uStack_c88);
    local_560._0_4_ = local_b20._0_4_;
    local_560._4_4_ = local_b20._4_4_;
    uStack_558._0_4_ = local_b20._8_4_;
    uStack_558._4_4_ = local_b20._12_4_;
    uStack_550._0_4_ = local_b20._16_4_;
    uStack_550._4_4_ = local_b20._20_4_;
    uStack_548._0_4_ = local_b20._24_4_;
    uStack_548._4_4_ = local_b20._28_4_;
    local_b60 = (float)local_ca0 + (float)local_560;
    fStack_b5c = local_e60._4_4_ + local_560._4_4_;
    fStack_b58 = (float)uStack_c98 + (float)uStack_558;
    fStack_b54 = uStack_e58._4_4_ + uStack_558._4_4_;
    fStack_b50 = (float)uStack_c90 + (float)uStack_550;
    fStack_b4c = uStack_e50._4_4_ + uStack_550._4_4_;
    fStack_b48 = (float)uStack_c88 + (float)uStack_548;
    fStack_b44 = uStack_c88._4_4_ + uStack_548._4_4_;
    local_4a0 = CONCAT44(fStack_b3c,local_b40);
    uStack_498 = CONCAT44(fStack_b34,fStack_b38);
    uStack_490 = CONCAT44(fStack_b2c,fStack_b30);
    uStack_488 = CONCAT44(fStack_b24,fStack_b28);
    local_b80 = (int)local_b40;
    iStack_b7c = (int)fStack_b3c;
    iStack_b78 = (int)fStack_b38;
    iStack_b74 = (int)fStack_b34;
    iStack_b70 = (int)fStack_b30;
    iStack_b6c = (int)fStack_b2c;
    iStack_b68 = (int)fStack_b28;
    iStack_b64 = (int)fStack_b24;
    local_4c0 = CONCAT44(fStack_b5c,local_b60);
    uStack_4b8 = CONCAT44(fStack_b54,fStack_b58);
    uStack_4b0 = CONCAT44(fStack_b4c,fStack_b50);
    uStack_4a8 = CONCAT44(fStack_b44,fStack_b48);
    local_ba0 = (int)local_b60;
    iStack_b9c = (int)fStack_b5c;
    iStack_b98 = (int)fStack_b58;
    iStack_b94 = (int)fStack_b54;
    iStack_b90 = (int)fStack_b50;
    iStack_b8c = (int)fStack_b4c;
    iStack_b88 = (int)fStack_b48;
    iStack_b84 = (int)fStack_b44;
    local_bb0 = CONCAT44(iStack_b7c,local_b80);
    uStack_ba8 = CONCAT44(iStack_b74,iStack_b78);
    local_bc0 = CONCAT44(iStack_b6c,iStack_b70);
    uStack_bb8 = CONCAT44(iStack_b64,iStack_b68);
    local_bd0 = CONCAT44(iStack_b9c,local_ba0);
    uStack_bc8 = CONCAT44(iStack_b94,iStack_b98);
    local_be0 = CONCAT44(iStack_b8c,iStack_b90);
    uStack_bd8 = CONCAT44(iStack_b84,iStack_b88);
    auVar22._8_8_ = uStack_ba8;
    auVar22._0_8_ = local_bb0;
    auVar21._8_8_ = uStack_bb8;
    auVar21._0_8_ = local_bc0;
    auVar1 = vpackssdw_avx(auVar22,auVar21);
    auVar20._8_8_ = uStack_bc8;
    auVar20._0_8_ = local_bd0;
    auVar19._8_8_ = uStack_bd8;
    auVar19._0_8_ = local_be0;
    auVar2 = vpackssdw_avx(auVar20,auVar19);
    local_bf0._0_8_ = auVar1._0_8_;
    local_380 = local_bf0._0_8_;
    local_bf0._8_8_ = auVar1._8_8_;
    uStack_378 = local_bf0._8_8_;
    local_362 = 0x7f;
    local_1f0 = 0x7f;
    auVar3 = vpinsrw_avx(ZEXT216(0x7f),0x7f,1);
    auVar3 = vpinsrw_avx(auVar3,0x7f,2);
    auVar3 = vpinsrw_avx(auVar3,0x7f,3);
    auVar3 = vpinsrw_avx(auVar3,0x7f,4);
    auVar3 = vpinsrw_avx(auVar3,0x7f,5);
    auVar3 = vpinsrw_avx(auVar3,0x7f,6);
    local_200 = vpinsrw_avx(auVar3,0x7f,7);
    local_390 = local_200._0_8_;
    uStack_388 = local_200._8_8_;
    auVar3 = vpminsw_avx(auVar1,local_200);
    local_c00._0_8_ = auVar2._0_8_;
    local_3a0 = local_c00._0_8_;
    local_c00._8_8_ = auVar2._8_8_;
    uStack_398 = local_c00._8_8_;
    local_364 = 0x7f;
    local_1d0 = 0x7f;
    auVar1 = vpinsrw_avx(ZEXT216(0x7f),0x7f,1);
    auVar1 = vpinsrw_avx(auVar1,0x7f,2);
    auVar1 = vpinsrw_avx(auVar1,0x7f,3);
    auVar1 = vpinsrw_avx(auVar1,0x7f,4);
    auVar1 = vpinsrw_avx(auVar1,0x7f,5);
    auVar1 = vpinsrw_avx(auVar1,0x7f,6);
    local_1e0 = vpinsrw_avx(auVar1,0x7f,7);
    local_3b0 = local_1e0._0_8_;
    uStack_3a8 = local_1e0._8_8_;
    auVar2 = vpminsw_avx(auVar2,local_1e0);
    local_bf0._0_8_ = auVar3._0_8_;
    local_2f0 = local_bf0._0_8_;
    local_bf0._8_8_ = auVar3._8_8_;
    uStack_2e8 = local_bf0._8_8_;
    local_366 = 0xff81;
    local_1b0 = 0xff81;
    auVar1 = vpinsrw_avx(ZEXT216(0xff81),0xff81,1);
    auVar1 = vpinsrw_avx(auVar1,0xff81,2);
    auVar1 = vpinsrw_avx(auVar1,0xff81,3);
    auVar1 = vpinsrw_avx(auVar1,0xff81,4);
    auVar1 = vpinsrw_avx(auVar1,0xff81,5);
    auVar1 = vpinsrw_avx(auVar1,0xff81,6);
    local_1c0 = vpinsrw_avx(auVar1,0xff81,7);
    local_300 = local_1c0._0_8_;
    uStack_2f8 = local_1c0._8_8_;
    local_bf0 = vpmaxsw_avx(auVar3,local_1c0);
    local_c00._0_8_ = auVar2._0_8_;
    local_310 = local_c00._0_8_;
    local_c00._8_8_ = auVar2._8_8_;
    uStack_308 = local_c00._8_8_;
    local_368 = 0xff81;
    local_190 = 0xff81;
    auVar1 = vpinsrw_avx(ZEXT216(0xff81),0xff81,1);
    auVar1 = vpinsrw_avx(auVar1,0xff81,2);
    auVar1 = vpinsrw_avx(auVar1,0xff81,3);
    auVar1 = vpinsrw_avx(auVar1,0xff81,4);
    auVar1 = vpinsrw_avx(auVar1,0xff81,5);
    auVar1 = vpinsrw_avx(auVar1,0xff81,6);
    local_1a0 = vpinsrw_avx(auVar1,0xff81,7);
    local_320 = local_1a0._0_8_;
    uStack_318 = local_1a0._8_8_;
    local_c00 = vpmaxsw_avx(auVar2,local_1a0);
    local_290 = local_bf0._0_8_;
    uStack_288 = local_bf0._8_8_;
    local_2a0 = local_c00._0_8_;
    uStack_298 = local_c00._8_8_;
    local_c10 = vpacksswb_avx(local_bf0,local_c00);
    local_c30 = local_c10._0_8_;
    uStack_c28 = local_c10._8_8_;
    *local_da0 = local_c10._0_8_;
    local_da0[1] = local_c10._8_8_;
    local_d98 = local_d98 + 0x10;
    local_da0 = local_da0 + 2;
    local_e04 = local_e04 + 0x10;
    uVar34 = CONCAT44(uStack_c88._4_4_,(float)uStack_c88);
    uVar39 = CONCAT44(uStack_c48._4_4_,(float)uStack_c48);
    local_ca0 = uVar8;
    uStack_c98 = uVar9;
    uStack_c90 = uVar10;
    uStack_c88 = uVar11;
    local_c80 = local_e00;
    uStack_c78 = uStack_df8;
    uStack_c70 = uStack_df0;
    uStack_c68 = uStack_de8;
    local_c60 = uVar6;
    uStack_c58 = uVar7;
    uStack_c50 = uVar4;
    uStack_c48 = uVar5;
    local_7fc = local_800;
    local_7f8 = local_800;
    local_7f4 = local_800;
    local_7f0 = local_800;
    local_7ec = local_800;
    local_7e8 = local_800;
    local_7e4 = local_800;
    local_560 = local_b20._0_8_;
    uStack_558 = local_b20._8_8_;
    uStack_550 = local_b20._16_8_;
    uStack_548 = local_b20._24_8_;
    local_520 = local_b00._0_8_;
    uStack_518 = local_b00._8_8_;
    uStack_510 = local_b00._16_8_;
    uStack_508 = local_b00._24_8_;
    local_430 = local_be0;
    uStack_428 = uStack_bd8;
    local_420 = local_bd0;
    uStack_418 = uStack_bc8;
    local_410 = local_bc0;
    uStack_408 = uStack_bb8;
    local_400 = local_bb0;
    uStack_3f8 = uStack_ba8;
    local_25c = local_260;
    local_258 = local_260;
    local_254 = local_260;
    local_250 = local_260;
    local_24c = local_260;
    local_248 = local_260;
    local_244 = local_260;
    local_1ee = local_1f0;
    local_1ec = local_1f0;
    local_1ea = local_1f0;
    local_1e8 = local_1f0;
    local_1e6 = local_1f0;
    local_1e4 = local_1f0;
    local_1e2 = local_1f0;
    local_1ce = local_1d0;
    local_1cc = local_1d0;
    local_1ca = local_1d0;
    local_1c8 = local_1d0;
    local_1c6 = local_1d0;
    local_1c4 = local_1d0;
    local_1c2 = local_1d0;
    local_1ae = local_1b0;
    local_1ac = local_1b0;
    local_1aa = local_1b0;
    local_1a8 = local_1b0;
    local_1a6 = local_1b0;
    local_1a4 = local_1b0;
    local_1a2 = local_1b0;
    local_18e = local_190;
    local_18c = local_190;
    local_18a = local_190;
    local_188 = local_190;
    local_186 = local_190;
    local_184 = local_190;
    local_182 = local_190;
  }
  for (; uStack_e68 = uVar4, fVar43 = uStack_e68._4_4_, fVar42 = uStack_e70._4_4_,
      fVar41 = uStack_e78._4_4_, fVar40 = local_e80._4_4_, local_e04 + 7 < local_db8;
      local_e04 = local_e04 + 8) {
    local_d50 = local_d98;
    uVar5 = *(undefined8 *)local_d98;
    uVar8 = *(undefined8 *)(local_d98 + 2);
    uVar9 = *(undefined8 *)(local_d98 + 4);
    uVar10 = *(undefined8 *)(local_d98 + 6);
    local_d00 = local_e00;
    uStack_cf8 = uStack_df8;
    uStack_cf0 = uStack_df0;
    uStack_ce8 = uStack_de8;
    local_ce0._0_4_ = (float)uVar5;
    local_ce0._4_4_ = (float)((ulong)uVar5 >> 0x20);
    uStack_cd8._0_4_ = (float)uVar8;
    uStack_cd8._4_4_ = (float)((ulong)uVar8 >> 0x20);
    uStack_cd0._0_4_ = (float)uVar9;
    uStack_cd0._4_4_ = (float)((ulong)uVar9 >> 0x20);
    uStack_cc8._0_4_ = (float)uVar10;
    uStack_cc8._4_4_ = (float)((ulong)uVar10 >> 0x20);
    local_ce0._0_4_ = (float)local_ce0 * (float)local_c80;
    local_e80._4_4_ = local_ce0._4_4_ * local_c80._4_4_;
    uStack_cd8._0_4_ = (float)uStack_cd8 * (float)uStack_c78;
    uStack_e78._4_4_ = uStack_cd8._4_4_ * uStack_c78._4_4_;
    uStack_cd0._0_4_ = (float)uStack_cd0 * (float)uStack_c70;
    uStack_e70._4_4_ = uStack_cd0._4_4_ * uStack_c70._4_4_;
    uStack_cc8._0_4_ = (float)uStack_cc8 * (float)uStack_c68;
    local_e80 = CONCAT44(local_e80._4_4_,(float)local_ce0);
    uStack_e78 = CONCAT44(uStack_e78._4_4_,(float)uStack_cd8);
    uStack_e70 = CONCAT44(uStack_e70._4_4_,(float)uStack_cd0);
    uStack_e68._4_4_ = uStack_cc8._4_4_;
    local_940 = &local_e80;
    local_934 = 0x3f000000;
    local_840 = 0x3f000000;
    auVar1 = vinsertps_avx(ZEXT416(0x3f000000),ZEXT416(0x3f000000),0x10);
    auVar1 = vinsertps_avx(auVar1,ZEXT416(0x3f000000),0x20);
    local_860 = vinsertps_avx(auVar1,ZEXT416(0x3f000000),0x30);
    auVar1 = vinsertps_avx(ZEXT416(0x3f000000),ZEXT416(0x3f000000),0x10);
    auVar1 = vinsertps_avx(auVar1,ZEXT416(0x3f000000),0x20);
    auStack_850 = vinsertps_avx(auVar1,ZEXT416(0x3f000000),0x30);
    local_960 = local_860._0_8_;
    uStack_958 = local_860._8_8_;
    uStack_950 = auStack_850._0_8_;
    uStack_948 = auStack_850._8_8_;
    local_728 = 0x80000000;
    local_220 = 0x80000000;
    auVar1 = vpinsrd_avx(ZEXT416(0x80000000),0x80000000,1);
    auVar1 = vpinsrd_avx(auVar1,0x80000000,2);
    local_240 = vpinsrd_avx(auVar1,0x80000000,3);
    auVar1 = vpinsrd_avx(ZEXT416(0x80000000),0x80000000,1);
    auVar1 = vpinsrd_avx(auVar1,0x80000000,2);
    auStack_230 = vpinsrd_avx(auVar1,0x80000000,3);
    local_780 = local_240._0_8_;
    uStack_778 = local_240._8_8_;
    uStack_770 = auStack_230._0_8_;
    uStack_768 = auStack_230._8_8_;
    local_980 = local_240._0_8_;
    uStack_978 = local_240._8_8_;
    uStack_970 = auStack_230._0_8_;
    uStack_968 = auStack_230._8_8_;
    local_700 = CONCAT44(local_e80._4_4_,(float)local_ce0);
    uStack_6f8 = CONCAT44(uStack_e78._4_4_,(float)uStack_cd8);
    uStack_6f0 = CONCAT44(uStack_e70._4_4_,(float)uStack_cd0);
    uStack_6e8 = CONCAT44(uStack_cc8._4_4_,(float)uStack_cc8);
    auVar25._4_4_ = local_e80._4_4_;
    auVar25._0_4_ = (float)local_ce0;
    auVar25._8_4_ = (float)uStack_cd8;
    auVar25._12_4_ = uStack_e78._4_4_;
    auVar25._16_4_ = (float)uStack_cd0;
    auVar25._20_4_ = uStack_e70._4_4_;
    auVar25._24_4_ = (float)uStack_cc8;
    auVar25._28_4_ = uStack_cc8._4_4_;
    local_720 = local_240._0_8_;
    uStack_718 = local_240._8_8_;
    uStack_710 = auStack_230._0_8_;
    uStack_708 = auStack_230._8_8_;
    auVar12._16_8_ = auStack_230._0_8_;
    auVar12._0_16_ = local_240;
    auVar12._24_8_ = auStack_230._8_8_;
    local_9a0 = vandps_avx(auVar25,auVar12);
    local_640 = local_860._0_8_;
    uStack_638 = local_860._8_8_;
    uStack_630 = auStack_850._0_8_;
    uStack_628 = auStack_850._8_8_;
    local_660 = local_9a0._0_8_;
    uStack_658 = local_9a0._8_8_;
    uStack_650 = local_9a0._16_8_;
    uStack_648 = local_9a0._24_8_;
    auVar15._16_8_ = auStack_850._0_8_;
    auVar15._0_16_ = local_860;
    auVar15._24_8_ = auStack_850._8_8_;
    local_9c0 = vorps_avx(auVar15,local_9a0);
    local_580 = CONCAT44(local_e80._4_4_,(float)local_ce0);
    uStack_578 = CONCAT44(uStack_e78._4_4_,(float)uStack_cd8);
    uStack_570 = CONCAT44(uStack_e70._4_4_,(float)uStack_cd0);
    uStack_568 = CONCAT44(uStack_cc8._4_4_,(float)uStack_cc8);
    local_5a0._0_4_ = local_9c0._0_4_;
    local_5a0._4_4_ = local_9c0._4_4_;
    uStack_598._0_4_ = local_9c0._8_4_;
    uStack_598._4_4_ = local_9c0._12_4_;
    uStack_590._0_4_ = local_9c0._16_4_;
    uStack_590._4_4_ = local_9c0._20_4_;
    uStack_588._0_4_ = local_9c0._24_4_;
    uStack_588._4_4_ = local_9c0._28_4_;
    local_9e0 = (float)local_ce0 + (float)local_5a0;
    fStack_9dc = local_e80._4_4_ + local_5a0._4_4_;
    fStack_9d8 = (float)uStack_cd8 + (float)uStack_598;
    fStack_9d4 = uStack_e78._4_4_ + uStack_598._4_4_;
    fStack_9d0 = (float)uStack_cd0 + (float)uStack_590;
    fStack_9cc = uStack_e70._4_4_ + uStack_590._4_4_;
    fStack_9c8 = (float)uStack_cc8 + (float)uStack_588;
    fStack_9c4 = uStack_cc8._4_4_ + uStack_588._4_4_;
    local_4e0 = CONCAT44(fStack_9dc,local_9e0);
    uStack_4d8 = CONCAT44(fStack_9d4,fStack_9d8);
    uStack_4d0 = CONCAT44(fStack_9cc,fStack_9d0);
    uStack_4c8 = CONCAT44(fStack_9c4,fStack_9c8);
    local_a00 = (int)local_9e0;
    iStack_9fc = (int)fStack_9dc;
    iStack_9f8 = (int)fStack_9d8;
    iStack_9f4 = (int)fStack_9d4;
    iStack_9f0 = (int)fStack_9d0;
    iStack_9ec = (int)fStack_9cc;
    iStack_9e8 = (int)fStack_9c8;
    iStack_9e4 = (int)fStack_9c4;
    local_a10 = CONCAT44(iStack_9fc,local_a00);
    uStack_a08 = CONCAT44(iStack_9f4,iStack_9f8);
    local_a20 = CONCAT44(iStack_9ec,iStack_9f0);
    uStack_a18 = CONCAT44(iStack_9e4,iStack_9e8);
    auVar2._8_8_ = uStack_a08;
    auVar2._0_8_ = local_a10;
    auVar1._8_8_ = uStack_a18;
    auVar1._0_8_ = local_a20;
    auVar1 = vpackssdw_avx(auVar2,auVar1);
    local_a30._0_8_ = auVar1._0_8_;
    local_3c0 = local_a30._0_8_;
    local_a30._8_8_ = auVar1._8_8_;
    uStack_3b8 = local_a30._8_8_;
    local_36a = 0x7f;
    local_170 = 0x7f;
    auVar2 = vpinsrw_avx(ZEXT216(0x7f),0x7f,1);
    auVar2 = vpinsrw_avx(auVar2,0x7f,2);
    auVar2 = vpinsrw_avx(auVar2,0x7f,3);
    auVar2 = vpinsrw_avx(auVar2,0x7f,4);
    auVar2 = vpinsrw_avx(auVar2,0x7f,5);
    auVar2 = vpinsrw_avx(auVar2,0x7f,6);
    local_180 = vpinsrw_avx(auVar2,0x7f,7);
    local_3d0 = local_180._0_8_;
    uStack_3c8 = local_180._8_8_;
    auVar2 = vpminsw_avx(auVar1,local_180);
    local_a30._0_8_ = auVar2._0_8_;
    local_330 = local_a30._0_8_;
    local_a30._8_8_ = auVar2._8_8_;
    uStack_328 = local_a30._8_8_;
    local_36c = 0xff81;
    local_150 = 0xff81;
    auVar1 = vpinsrw_avx(ZEXT216(0xff81),0xff81,1);
    auVar1 = vpinsrw_avx(auVar1,0xff81,2);
    auVar1 = vpinsrw_avx(auVar1,0xff81,3);
    auVar1 = vpinsrw_avx(auVar1,0xff81,4);
    auVar1 = vpinsrw_avx(auVar1,0xff81,5);
    auVar1 = vpinsrw_avx(auVar1,0xff81,6);
    local_160 = vpinsrw_avx(auVar1,0xff81,7);
    local_340 = local_160._0_8_;
    uStack_338 = local_160._8_8_;
    local_a30 = vpmaxsw_avx(auVar2,local_160);
    local_2c0 = local_a30._0_8_;
    uStack_2b8 = local_a30._8_8_;
    local_a40 = vpacksswb_avx(local_a30,local_a30);
    local_f0 = local_a40._0_8_;
    uStack_e8 = local_a40._8_8_;
    *local_da0 = local_a40._0_8_;
    local_d98 = local_d98 + 8;
    local_da0 = local_da0 + 1;
    uVar4 = CONCAT44(uStack_cc8._4_4_,(float)uStack_cc8);
    local_ce0 = uVar5;
    uStack_cd8 = uVar8;
    uStack_cd0 = uVar9;
    uStack_cc8 = uVar10;
    local_83c = local_840;
    local_838 = local_840;
    local_834 = local_840;
    local_830 = local_840;
    local_82c = local_840;
    local_828 = local_840;
    local_824 = local_840;
    local_5a0 = local_9c0._0_8_;
    uStack_598 = local_9c0._8_8_;
    uStack_590 = local_9c0._16_8_;
    uStack_588 = local_9c0._24_8_;
    local_450 = local_a20;
    uStack_448 = uStack_a18;
    local_440 = local_a10;
    uStack_438 = uStack_a08;
    local_2b0 = local_2c0;
    uStack_2a8 = uStack_2b8;
    local_21c = local_220;
    local_218 = local_220;
    local_214 = local_220;
    local_210 = local_220;
    local_20c = local_220;
    local_208 = local_220;
    local_204 = local_220;
    local_16e = local_170;
    local_16c = local_170;
    local_16a = local_170;
    local_168 = local_170;
    local_166 = local_170;
    local_164 = local_170;
    local_162 = local_170;
    local_14e = local_150;
    local_14c = local_150;
    local_14a = local_150;
    local_148 = local_150;
    local_146 = local_150;
    local_144 = local_150;
    local_142 = local_150;
  }
  for (; fVar29 = uStack_e88._4_4_, fVar28 = local_e90._4_4_, uVar4 = local_e90, uVar5 = uStack_e88,
      uVar8 = local_e80, uVar9 = uStack_e78, uVar10 = uStack_e70, uVar11 = uStack_e68,
      uVar30 = local_e60, uVar31 = uStack_e58, uVar32 = uStack_e50, uVar33 = uStack_e48,
      uVar35 = local_e40, uVar36 = uStack_e38, uVar37 = uStack_e30, uVar38 = uStack_e28,
      local_d70 = local_dbc, fStack_d6c = local_dbc, fStack_d68 = local_dbc, fStack_d64 = local_dbc,
      local_d58 = local_dbc, local_d54 = local_dbc, local_c80 = uVar34, uStack_c78 = uVar39,
      uStack_c70 = uVar6, uStack_c68 = uVar7, local_7e0 = auVar53, local_7b0 = local_dbc,
      local_7ac = local_dbc, local_7a8 = local_dbc, local_7a4 = local_dbc, local_7a0 = local_dbc,
      local_79c = local_dbc, local_798 = local_dbc, local_794 = local_dbc, local_e90._4_4_ = fVar28,
      uStack_e88._4_4_ = fVar29, local_e04 + 3 < local_db8; local_e04 = local_e04 + 4) {
    local_d30 = local_d98;
    uVar4 = *(undefined8 *)local_d98;
    uVar5 = *(undefined8 *)(local_d98 + 2);
    local_920._0_4_ = (float)uVar4;
    local_920._4_4_ = (float)((ulong)uVar4 >> 0x20);
    uStack_918._0_4_ = (float)uVar5;
    uStack_918._4_4_ = (float)((ulong)uVar5 >> 0x20);
    local_930._0_4_ = (float)local_dd0;
    local_930._4_4_ = (float)((ulong)local_dd0 >> 0x20);
    uStack_928._0_4_ = (float)uStack_dc8;
    uStack_928._4_4_ = (float)((ulong)uStack_dc8 >> 0x20);
    local_920._0_4_ = (float)local_920 * (float)local_930;
    local_e90._4_4_ = local_920._4_4_ * local_930._4_4_;
    uStack_918._0_4_ = (float)uStack_918 * (float)uStack_928;
    uStack_e88._4_4_ = uStack_918._4_4_ * uStack_928._4_4_;
    local_e90 = CONCAT44(local_e90._4_4_,(float)local_920);
    uStack_e88 = CONCAT44(uStack_e88._4_4_,(float)uStack_918);
    local_888 = &local_e90;
    local_870 = 0x3f000000;
    local_880 = 0x3f000000;
    local_8a0 = 0x3f0000003f000000;
    uStack_898 = 0x3f0000003f000000;
    local_c4 = 0x80000000;
    local_40 = 0x80000000;
    auVar1 = vpinsrd_avx(ZEXT416(0x80000000),0x80000000,1);
    auVar1 = vpinsrd_avx(auVar1,0x80000000,2);
    local_50 = vpinsrd_avx(auVar1,0x80000000,3);
    local_e0 = local_50._0_8_;
    uStack_d8 = local_50._8_8_;
    local_8b0 = local_50._0_8_;
    uStack_8a8 = local_50._8_8_;
    local_b0 = CONCAT44(local_e90._4_4_,(float)local_920);
    uStack_a8 = CONCAT44(uStack_e88._4_4_,(float)uStack_918);
    auVar24._4_4_ = local_e90._4_4_;
    auVar24._0_4_ = (float)local_920;
    auVar24._8_4_ = (float)uStack_918;
    auVar24._12_4_ = uStack_e88._4_4_;
    local_c0 = local_50._0_8_;
    uStack_b8 = local_50._8_8_;
    local_8c0 = vpand_avx(auVar24,local_50);
    local_a0 = local_8c0._0_8_;
    uStack_98 = local_8c0._8_8_;
    auVar23._8_8_ = 0x3f0000003f000000;
    auVar23._0_8_ = 0x3f0000003f000000;
    local_8d0 = vpor_avx(auVar23,local_8c0);
    local_70 = CONCAT44(local_e90._4_4_,(float)local_920);
    uStack_68 = CONCAT44(uStack_e88._4_4_,(float)uStack_918);
    local_80._0_4_ = local_8d0._0_4_;
    local_80._4_4_ = local_8d0._4_4_;
    uStack_78._0_4_ = local_8d0._8_4_;
    uStack_78._4_4_ = local_8d0._12_4_;
    local_8e0 = (float)local_920 + (float)local_80;
    fStack_8dc = local_e90._4_4_ + local_80._4_4_;
    fStack_8d8 = (float)uStack_918 + (float)uStack_78;
    fStack_8d4 = uStack_e88._4_4_ + uStack_78._4_4_;
    local_60 = CONCAT44(fStack_8dc,local_8e0);
    uStack_58 = CONCAT44(fStack_8d4,fStack_8d8);
    local_8f0 = (int)local_8e0;
    iStack_8ec = (int)fStack_8dc;
    iStack_8e8 = (int)fStack_8d8;
    iStack_8e4 = (int)fStack_8d4;
    local_470 = CONCAT44(iStack_8ec,local_8f0);
    uStack_468 = CONCAT44(iStack_8e4,iStack_8e8);
    auVar18._8_8_ = uStack_468;
    auVar18._0_8_ = local_470;
    auVar3._8_8_ = uStack_468;
    auVar3._0_8_ = local_470;
    auVar1 = vpackssdw_avx(auVar18,auVar3);
    local_900._0_8_ = auVar1._0_8_;
    local_3e0 = local_900._0_8_;
    local_900._8_8_ = auVar1._8_8_;
    uStack_3d8 = local_900._8_8_;
    local_36e = 0x7f;
    local_130 = 0x7f;
    auVar2 = vpinsrw_avx(ZEXT216(0x7f),0x7f,1);
    auVar2 = vpinsrw_avx(auVar2,0x7f,2);
    auVar2 = vpinsrw_avx(auVar2,0x7f,3);
    auVar2 = vpinsrw_avx(auVar2,0x7f,4);
    auVar2 = vpinsrw_avx(auVar2,0x7f,5);
    auVar2 = vpinsrw_avx(auVar2,0x7f,6);
    local_140 = vpinsrw_avx(auVar2,0x7f,7);
    local_3f0 = local_140._0_8_;
    uStack_3e8 = local_140._8_8_;
    auVar2 = vpminsw_avx(auVar1,local_140);
    local_900._0_8_ = auVar2._0_8_;
    local_350 = local_900._0_8_;
    local_900._8_8_ = auVar2._8_8_;
    uStack_348 = local_900._8_8_;
    local_370 = 0xff81;
    local_110 = 0xff81;
    auVar1 = vpinsrw_avx(ZEXT216(0xff81),0xff81,1);
    auVar1 = vpinsrw_avx(auVar1,0xff81,2);
    auVar1 = vpinsrw_avx(auVar1,0xff81,3);
    auVar1 = vpinsrw_avx(auVar1,0xff81,4);
    auVar1 = vpinsrw_avx(auVar1,0xff81,5);
    auVar1 = vpinsrw_avx(auVar1,0xff81,6);
    local_120 = vpinsrw_avx(auVar1,0xff81,7);
    local_360 = local_120._0_8_;
    uStack_358 = local_120._8_8_;
    local_900 = vpmaxsw_avx(auVar2,local_120);
    local_2e0 = local_900._0_8_;
    uStack_2d8 = local_900._8_8_;
    local_910 = vpacksswb_avx(local_900,local_900);
    local_100 = local_910._0_8_;
    uStack_f8 = local_910._8_8_;
    *(char *)local_da0 = local_910[0];
    *(char *)((long)local_da0 + 1) = local_910[1];
    *(char *)((long)local_da0 + 2) = local_910[2];
    *(char *)((long)local_da0 + 3) = local_910[3];
    local_d98 = local_d98 + 4;
    local_da0 = (undefined8 *)((long)local_da0 + 4);
    local_930 = local_dd0;
    uStack_928 = uStack_dc8;
    local_920 = uVar4;
    uStack_918 = uVar5;
    uStack_87c = local_880;
    uStack_878 = local_880;
    uStack_874 = local_880;
    local_460 = local_470;
    uStack_458 = uStack_468;
    local_2d0 = local_2e0;
    uStack_2c8 = uStack_2d8;
    local_12e = local_130;
    local_12c = local_130;
    local_12a = local_130;
    local_128 = local_130;
    local_126 = local_130;
    local_124 = local_130;
    local_122 = local_130;
    local_10e = local_110;
    local_10c = local_110;
    local_10a = local_110;
    local_108 = local_110;
    local_106 = local_110;
    local_104 = local_110;
    local_102 = local_110;
    local_90 = local_8a0;
    uStack_88 = uStack_898;
    local_80 = local_8d0._0_8_;
    uStack_78 = local_8d0._8_8_;
    local_3c = local_40;
    local_38 = local_40;
    local_34 = local_40;
  }
  for (; uStack_e28._4_4_ = fVar51, uStack_e30._4_4_ = fVar50, uStack_e38._4_4_ = fVar49,
      local_e40._4_4_ = fVar48, uStack_e48._4_4_ = fVar47, uStack_e50._4_4_ = fVar46,
      uStack_e58._4_4_ = fVar45, local_e60._4_4_ = fVar44, uStack_e68._4_4_ = fVar43,
      uStack_e70._4_4_ = fVar42, uStack_e78._4_4_ = fVar41, local_e80._4_4_ = fVar40,
      uStack_e28 = uVar38, uStack_e30 = uVar37, uStack_e38 = uVar36, local_e40 = uVar35,
      uStack_e48 = uVar33, uStack_e50 = uVar32, uStack_e58 = uVar31, local_e60 = uVar30,
      uStack_e68 = uVar11, uStack_e70 = uVar10, uStack_e78 = uVar9, local_e80 = uVar8,
      uStack_e88 = uVar5, local_e90 = uVar4, fVar29 = uStack_e28._4_4_, fVar28 = uStack_e30._4_4_,
      fVar43 = uStack_e38._4_4_, fVar42 = local_e40._4_4_, fVar41 = uStack_e48._4_4_,
      fVar40 = uStack_e50._4_4_, fVar51 = uStack_e58._4_4_, fVar50 = local_e60._4_4_,
      fVar49 = uStack_e68._4_4_, fVar48 = uStack_e70._4_4_, fVar47 = uStack_e78._4_4_,
      fVar46 = local_e80._4_4_, fVar45 = uStack_e88._4_4_, fVar44 = local_e90._4_4_,
      local_e04 < local_db8; local_e04 = local_e04 + 1) {
    local_868 = *local_d98 * local_dbc;
    uVar34 = local_e90;
    local_e90._4_4_ = fVar44;
    uVar39 = uStack_e88;
    uStack_e88._4_4_ = fVar45;
    uVar6 = local_e80;
    local_e80._4_4_ = fVar46;
    uVar7 = uStack_e78;
    uStack_e78._4_4_ = fVar47;
    uVar4 = uStack_e70;
    uStack_e70._4_4_ = fVar48;
    uVar5 = uStack_e68;
    uStack_e68._4_4_ = fVar49;
    uVar8 = local_e60;
    local_e60._4_4_ = fVar50;
    uVar9 = uStack_e58;
    uStack_e58._4_4_ = fVar51;
    uVar10 = uStack_e50;
    uStack_e50._4_4_ = fVar40;
    uVar11 = uStack_e48;
    uStack_e48._4_4_ = fVar41;
    uVar30 = local_e40;
    local_e40._4_4_ = fVar42;
    uVar31 = uStack_e38;
    uStack_e38._4_4_ = fVar43;
    uVar32 = uStack_e30;
    uStack_e30._4_4_ = fVar28;
    uVar33 = uStack_e28;
    uStack_e28._4_4_ = fVar29;
    dVar52 = std::round((double)(ulong)(uint)local_868);
    uVar38 = uStack_e28;
    uVar37 = uStack_e30;
    uVar36 = uStack_e38;
    uVar35 = local_e40;
    uVar33 = uStack_e48;
    uVar32 = uStack_e50;
    uVar31 = uStack_e58;
    uVar30 = local_e60;
    uVar11 = uStack_e68;
    uVar10 = uStack_e70;
    uVar9 = uStack_e78;
    uVar8 = local_e80;
    uVar5 = uStack_e88;
    uVar4 = local_e90;
    local_86c = (int)SUB84(dVar52,0);
    if (local_86c < 0x80) {
      if (local_86c < -0x7f) {
        local_861 = 0x81;
      }
      else {
        local_861 = (undefined1)local_86c;
      }
    }
    else {
      local_861 = 0x7f;
    }
    *(undefined1 *)local_da0 = local_861;
    local_d98 = local_d98 + 1;
    local_da0 = (undefined8 *)((long)local_da0 + 1);
    fVar40 = local_e80._4_4_;
    fVar41 = uStack_e78._4_4_;
    fVar42 = uStack_e70._4_4_;
    fVar43 = uStack_e68._4_4_;
    fVar44 = local_e60._4_4_;
    fVar45 = uStack_e58._4_4_;
    fVar46 = uStack_e50._4_4_;
    fVar47 = uStack_e48._4_4_;
    fVar48 = local_e40._4_4_;
    fVar49 = uStack_e38._4_4_;
    fVar50 = uStack_e30._4_4_;
    fVar51 = uStack_e28._4_4_;
  }
  return;
}

Assistant:

static void quantize(const float* ptr, signed char* s8ptr, const Mat& scale_data, int elemcount, int elempack)
{
    const int scale_data_size = scale_data.w;
    const int size = elemcount * elempack;

    // NCNN_LOGE("quantize %d   %d %d", scale_data_size, elemcount, elempack);

    float scale = scale_data[0];
#if __SSE2__
    __m128 _scale = _mm_set1_ps(scale);
#if __AVX__
    __m256 _scale_avx = _mm256_set1_ps(scale);
#if __AVX512F__
    __m512 _scale_avx512 = _mm512_set1_ps(scale);
#endif // __AVX512F__
#endif // __AVX__
    if (scale_data_size > 1)
    {
#if __AVX__
#if __AVX512F__
        if (elempack == 16)
        {
            _scale_avx512 = _mm512_loadu_ps((const float*)scale_data);
        }
#endif // __AVX512F__
        if (elempack == 8)
        {
            _scale_avx = _mm256_loadu_ps((const float*)scale_data);
#if __AVX512F__
            _scale_avx512 = combine8x2_ps(_scale_avx, _scale_avx);
#endif // __AVX512F__
        }
#endif // __AVX__
        if (elempack == 4)
        {
            _scale = _mm_loadu_ps((const float*)scale_data);
#if __AVX__
            _scale_avx = combine4x2_ps(_scale, _scale);
#if __AVX512F__
            _scale_avx512 = combine8x2_ps(_scale_avx, _scale_avx);
#endif // __AVX512F__
#endif // __AVX__
        }
    }
#endif // __SSE2__

    int i = 0;
#if __SSE2__
#if __AVX__
    for (; i + 15 < size; i += 16)
    {
#if __AVX512F__
        __m512 _v = _mm512_loadu_ps(ptr);
        _v = _mm512_mul_ps(_v, _scale_avx512);
        _mm_storeu_si128((__m128i*)s8ptr, float2int8_avx512(_v));
#else  // __AVX512F__
        __m256 _v0 = _mm256_loadu_ps(ptr);
        __m256 _v1 = _mm256_loadu_ps(ptr + 8);
        _v0 = _mm256_mul_ps(_v0, _scale_avx);
        _v1 = _mm256_mul_ps(_v1, _scale_avx);
        _mm_storeu_si128((__m128i*)s8ptr, float2int8_avx(_v0, _v1));
#endif // __AVX512F__
        ptr += 16;
        s8ptr += 16;
    }
#endif // __AVX__
    for (; i + 7 < size; i += 8)
    {
#if __AVX__
        __m256 _v = _mm256_loadu_ps(ptr);
        _v = _mm256_mul_ps(_v, _scale_avx);
        *(int64_t*)s8ptr = float2int8_avx(_v);
#else  // __AVX__
        __m128 _v0 = _mm_loadu_ps(ptr);
        __m128 _v1 = _mm_loadu_ps(ptr + 4);
        _v0 = _mm_mul_ps(_v0, _scale);
        _v1 = _mm_mul_ps(_v1, _scale);
        *(int64_t*)s8ptr = float2int8_sse(_v0, _v1);
#endif // __AVX__
        ptr += 8;
        s8ptr += 8;
    }
    for (; i + 3 < size; i += 4)
    {
        __m128 _v = _mm_loadu_ps(ptr);
        _v = _mm_mul_ps(_v, _scale);
        int32_t v = float2int8_sse(_v);
        s8ptr[0] = (v >> 0) & 0xff;
        s8ptr[1] = (v >> 8) & 0xff;
        s8ptr[2] = (v >> 16) & 0xff;
        s8ptr[3] = (v >> 24) & 0xff;
        ptr += 4;
        s8ptr += 4;
    }
#endif // __SSE2__
    for (; i < size; i++)
    {
        float v = *ptr * scale;
        *s8ptr = float2int8(v);
        ptr++;
        s8ptr++;
    }
}